

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_28638a::WaveBackend::mixerProc(WaveBackend *this)

{
  ALuint AVar1;
  ALuint AVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ALCdevice *pAVar9;
  milliseconds restTime;
  
  pAVar9 = (this->super_BackendBase).mDevice;
  restTime.__r = (ulong)(pAVar9->UpdateSize * 1000) / (ulong)pAVar9->Frequency >> 1;
  althrd_setname("alsoft-mixer");
  AVar1 = ALCdevice::channelsFromFmt((this->super_BackendBase).mDevice);
  AVar2 = ALCdevice::frameSizeFromFmt((this->super_BackendBase).mDevice);
  lVar4 = std::chrono::_V2::steady_clock::now();
  uVar8 = 0;
  do {
    while( true ) {
      if ((((this->mKillNow)._M_base._M_i & 1U) != 0) ||
         (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0)) {
        return 0;
      }
      lVar5 = std::chrono::_V2::steady_clock::now();
      pAVar9 = (this->super_BackendBase).mDevice;
      lVar5 = (long)((lVar5 - lVar4) * (ulong)pAVar9->Frequency) / 1000000000;
      if ((long)(ulong)pAVar9->UpdateSize <= (long)(lVar5 - uVar8)) break;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&restTime);
    }
    do {
      pAVar9 = (this->super_BackendBase).mDevice;
      if ((long)(lVar5 - uVar8) < (long)(ulong)pAVar9->UpdateSize) goto LAB_00163bb8;
      ALCdevice::renderSamples
                (pAVar9,(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                        _M_impl.super__Vector_impl_data._M_start,pAVar9->UpdateSize,(ulong)AVar1);
      uVar7 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
      uVar8 = uVar8 + uVar7;
      fwrite((this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)AVar2,uVar7,(FILE *)this->mFile);
      iVar3 = ferror((FILE *)this->mFile);
    } while (iVar3 == 0);
    if (0 < (int)gLogLevel) {
      fwrite("[ALSOFT] (EE) Error writing to file\n",0x24,1,(FILE *)gLogFile);
    }
    ALCdevice::handleDisconnect
              ((this->super_BackendBase).mDevice,"Failed to write playback samples");
    pAVar9 = (this->super_BackendBase).mDevice;
LAB_00163bb8:
    uVar7 = (ulong)pAVar9->Frequency;
    if ((long)uVar7 <= (long)uVar8) {
      uVar6 = uVar8 / uVar7;
      uVar8 = uVar8 % uVar7;
      lVar4 = lVar4 + uVar6 * 1000000000;
    }
  } while( true );
}

Assistant:

int WaveBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    althrd_setname(MIXER_THREAD_NAME);

    const size_t frameStep{mDevice->channelsFromFmt()};
    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) *
            mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(mBuffer.data(), mDevice->UpdateSize, frameStep);
            done += mDevice->UpdateSize;

            if /*constexpr*/(!IS_LITTLE_ENDIAN)
            {
                const ALuint bytesize{mDevice->bytesFromFmt()};

                if(bytesize == 2)
                {
                    ALushort *samples = reinterpret_cast<ALushort*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 2};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALushort samp{samples[i]};
                        samples[i] = static_cast<ALushort>((samp>>8) | (samp<<8));
                    }
                }
                else if(bytesize == 4)
                {
                    ALuint *samples = reinterpret_cast<ALuint*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 4};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALuint samp{samples[i]};
                        samples[i] = (samp>>24) | ((samp>>8)&0x0000ff00) |
                                     ((samp<<8)&0x00ff0000) | (samp<<24);
                    }
                }
            }

            size_t fs{fwrite(mBuffer.data(), frameSize, mDevice->UpdateSize, mFile)};
            (void)fs;
            if(ferror(mFile))
            {
                ERR("Error writing to file\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}